

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# declaration.cc
# Opt level: O2

ostream * __thiscall
tchecker::parsing::process_declaration_t::output(process_declaration_t *this,ostream *os)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(os,"process:");
  poVar1 = std::operator<<(poVar1,(string *)&this->_name);
  poVar1 = operator<<(poVar1,&(this->super_inner_declaration_t).super_declaration_t._attr);
  return poVar1;
}

Assistant:

std::ostream & process_declaration_t::output(std::ostream & os) const { return os << "process:" << _name << _attr; }